

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDeclNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *name)

{
  SchemaInfo *pSVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  Grammar *pGVar5;
  ulong uVar6;
  XercesAttGroupInfo *pXVar7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  undefined8 *puVar10;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_38;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_38.fScopeAdded = false;
  }
  else {
    local_38.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_38.fSchemaInfo = pSVar1;
  pGVar5 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if ((pGVar5 == (Grammar *)0x0) ||
     (iVar4 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(pGVar5), iVar4 != 1)) {
    pXVar7 = (XercesAttGroupInfo *)0x0;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,uriStr,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    pp_Var2 = pGVar5[9].super_XSerializable._vptr_XSerializable;
    if ((name == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*name, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      XVar9 = name[1];
      if (XVar9 != L'\0') {
        pXVar8 = name + 2;
        do {
          uVar6 = (ulong)(ushort)XVar9 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar9 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar9 != L'\0');
      }
      uVar6 = uVar6 % (ulong)pp_Var2[3];
    }
    puVar10 = *(undefined8 **)(pp_Var2[2] + uVar6 * 8);
    if (puVar10 != (undefined8 *)0x0) {
      do {
        bVar3 = StringHasher::equals((StringHasher *)(pp_Var2 + 6),name,(void *)puVar10[2]);
        if (bVar3) goto LAB_00340eb9;
        puVar10 = (undefined8 *)puVar10[1];
      } while (puVar10 != (undefined8 *)0x0);
    }
    puVar10 = (undefined8 *)0x0;
LAB_00340eb9:
    if (puVar10 == (undefined8 *)0x0) {
      pXVar7 = (XercesAttGroupInfo *)0x0;
    }
    else {
      pXVar7 = (XercesAttGroupInfo *)*puVar10;
    }
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_38);
  return pXVar7;
}

Assistant:

inline XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDeclNS(const DOMElement* const elem,
                                             const XMLCh* const uriStr,
                                             const XMLCh* const name) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // Get grammar information
    // ------------------------------------------------------------------
    Grammar* aGrammar = fGrammarResolver->getGrammar(uriStr);

    if (!aGrammar || aGrammar->getGrammarType() != Grammar::SchemaGrammarType) {

        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
        return 0;
    }

    XercesAttGroupInfo* attGroupInfo = ((SchemaGrammar*)aGrammar)->getAttGroupInfoRegistry()->get(name);

    return attGroupInfo;
}